

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_NtkSharePrint(Abc_ShaMan_t *p)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  void *__ptr;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  long lVar7;
  ulong uVar8;
  int i;
  int iVar9;
  int i_00;
  ulong uVar10;
  size_t __size;
  
  __size = (long)p->vObj2Lit->nSize + 1;
  pvVar6 = malloc(__size);
  __ptr = calloc(__size,4);
  iVar9 = 0;
  do {
    if (p->vBuckets->nSize <= iVar9) {
      for (uVar10 = 0; (long)uVar10 < (long)p->vObj2Lit->nSize; uVar10 = uVar10 + 1) {
        if (0 < *(int *)((long)__ptr + uVar10 * 4)) {
          printf("%d=%d ",uVar10 & 0xffffffff);
        }
      }
      putchar(10);
      uVar8 = 0;
      uVar10 = (ulong)(uint)p->nStartCols;
      if (p->nStartCols < 1) {
        uVar10 = uVar8;
      }
      uVar4 = 0;
      for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        uVar4 = (uVar4 + *(int *)((long)__ptr + uVar8 * 4)) - 1;
      }
      printf("Total = %d.  ",(ulong)uVar4);
      printf("Gates = %d.\n",(ulong)((uVar4 + p->vObj2Lit->nSize) - p->nStartCols));
      free(__ptr);
      free(pvVar6);
      printf("Bucket contents: ");
      for (iVar9 = 0; iVar9 < p->vBuckets->nSize; iVar9 = iVar9 + 1) {
        pvVar6 = Vec_PtrEntry(p->vBuckets,iVar9);
        printf("%d ",(ulong)*(uint *)((long)pvVar6 + 4));
      }
      putchar(10);
      return;
    }
    p_00 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,iVar9);
    for (i = 0; i < p_00->nSize; i = i + 1) {
      p_01 = (Vec_Int_t *)Vec_PtrEntry(p_00,i);
      pVVar2 = p->vObj2Lit;
      for (lVar7 = 0; lVar7 < pVVar2->nSize; lVar7 = lVar7 + 1) {
        *(undefined1 *)((long)pvVar6 + lVar7) = 0x30;
      }
      *(undefined1 *)((long)pvVar6 + lVar7) = 0;
      for (i_00 = 2; i_00 < p_01->nSize; i_00 = i_00 + 1) {
        iVar3 = Vec_IntEntry(p_01,i_00);
        if (p->vObj2Lit->nSize <= iVar3) {
          __assert_fail("ObjId < Vec_IntSize(p->vObj2Lit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                        ,0x180,"void Abc_NtkSharePrint(Abc_ShaMan_t *)");
        }
        *(undefined1 *)((long)pvVar6 + (long)iVar3) = 0x31;
        piVar1 = (int *)((long)__ptr + (long)iVar3 * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar4 = Vec_IntEntry(p_01,0);
      uVar5 = Vec_IntEntry(p_01,1);
      printf("%4d%3d: %s\n",(ulong)uVar4,(ulong)uVar5);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void Abc_NtkSharePrint( Abc_ShaMan_t * p )
{
    Vec_Ptr_t * vBucket;
    Vec_Int_t * vInput;
    int i, k, j, ObjId;
    char * pBuffer = ABC_ALLOC( char, Vec_IntSize(p->vObj2Lit) + 1 );
    int * pCounters = ABC_CALLOC( int, Vec_IntSize(p->vObj2Lit) + 1 );
    int nTotal = 0;
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
    Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, j )
    {
        for ( k = 0; k < Vec_IntSize(p->vObj2Lit); k++ )
            pBuffer[k] = '0';
        pBuffer[k] = 0;

        Vec_IntForEachEntryStart( vInput, ObjId, k, SHARE_NUM )
        {
            assert( ObjId < Vec_IntSize(p->vObj2Lit) );
            pBuffer[ObjId] = '1';
            pCounters[ObjId]++;
        }
        printf( "%4d%3d: %s\n", Vec_IntEntry(vInput, 0), Vec_IntEntry(vInput, 1), pBuffer );
    }

    for ( i = 0; i < Vec_IntSize(p->vObj2Lit); i++ )
        if ( pCounters[i] > 0 )
            printf( "%d=%d ", i, pCounters[i] ); 
    printf( "\n" );

    nTotal = 0;
    for ( i = 0; i < p->nStartCols; i++ )
        nTotal += pCounters[i] - 1;
    printf( "Total = %d.  ", nTotal );
    printf( "Gates = %d.\n", Vec_IntSize(p->vObj2Lit) - p->nStartCols + nTotal );

    ABC_FREE( pCounters );
    ABC_FREE( pBuffer );

    printf( "Bucket contents: " );
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
        printf( "%d ", Vec_PtrSize(vBucket) );
    printf( "\n" );
}